

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_list.cpp
# Opt level: O3

uint64_t __thiscall
duckdb::LogicalDependencyHashFunction::operator()
          (LogicalDependencyHashFunction *this,LogicalDependency *a)

{
  hash_t hVar1;
  hash_t hVar2;
  hash_t hVar3;
  ulong uVar4;
  
  hVar1 = Hash<char_const*>((a->entry).name._M_dataplus._M_p);
  hVar2 = Hash<char_const*>((a->entry).schema._M_dataplus._M_p);
  hVar3 = Hash<char_const*>((a->catalog)._M_dataplus._M_p);
  uVar4 = (ulong)(a->entry).type * -0x2917014799a6026d;
  uVar4 = (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
  return hVar3 ^ hVar2 ^ hVar1 ^ uVar4 ^ uVar4 >> 0x20;
}

Assistant:

uint64_t LogicalDependencyHashFunction::operator()(const LogicalDependency &a) const {
	auto &name = a.entry.name;
	auto &schema = a.entry.schema;
	auto &type = a.entry.type;
	auto &catalog = a.catalog;

	hash_t hash = duckdb::Hash(name.c_str());
	hash = CombineHash(hash, duckdb::Hash(schema.c_str()));
	hash = CombineHash(hash, duckdb::Hash(catalog.c_str()));
	hash = CombineHash(hash, duckdb::Hash<uint8_t>(static_cast<uint8_t>(type)));
	return hash;
}